

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-ni.c
# Opt level: O3

void sha1_ni_digest(ssh_hash *hash,uint8_t *digest)

{
  BinarySink *pBVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  
  pBVar1 = hash[-3].binarysink_;
  uVar2 = 0x37U - *(int *)&hash[-3].vt & 0x3f;
  uVar3 = (ulong)uVar2;
  BinarySink_put_byte(hash[-1].binarysink_,0x80);
  if (uVar2 != 0) {
    do {
      BinarySink_put_byte(hash[-1].binarysink_,'\0');
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  BinarySink_put_uint64(hash[-1].binarysink_,(long)pBVar1 << 3);
  if (hash[-3].vt == (ssh_hashalg *)0x0) {
    auVar4 = pshufb((undefined1  [16])hash[-9],_DAT_00141170);
    *(undefined1 (*) [16])digest = auVar4;
    uVar2 = *(uint *)((long)&hash[-8].binarysink_ + 4);
    *(uint *)(digest + 0x10) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    return;
  }
  __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha1.h",
                0x6c,"void sha1_block_pad(sha1_block *, BinarySink *)");
}

Assistant:

static void sha1_ni_digest(ssh_hash *hash, uint8_t *digest)
{
    sha1_ni *s = container_of(hash, sha1_ni, hash);

    sha1_block_pad(&s->blk, BinarySink_UPCAST(s));

    /* Rearrange the first vector into its output order */
    __m128i abcd = _mm_shuffle_epi32(s->core[0], 0x1B);

    /* Byte-swap it into the output endianness */
    const __m128i mask = _mm_setr_epi8(3,2,1,0,7,6,5,4,11,10,9,8,15,14,13,12);
    abcd = _mm_shuffle_epi8(abcd, mask);

    /* And store it */
    _mm_storeu_si128((__m128i *)digest, abcd);

    /* Finally, store the leftover word */
    uint32_t e = _mm_extract_epi32(s->core[1], 3);
    PUT_32BIT_MSB_FIRST(digest + 16, e);
}